

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct32_stage8_avx2(__m256i *bf1,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                       __m256i *clamp_hi,__m256i *rounding,int bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i *in_RCX;
  __m256i *in_RDX;
  __m256i *in_RSI;
  __m256i *in_RDI;
  __m256i *in_R8;
  __m256i *in_R9;
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  __m256i temp1;
  __m256i *in_stack_ffffffffffffff98;
  int bit_00;
  __m256i *in_stack_ffffffffffffffd0;
  __m256i in_stack_ffffffffffffffd8;
  
  in1[1] = (longlong)in_RSI;
  in1[0] = (longlong)in_RDX;
  in1[2] = (longlong)in_RDI;
  in1[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_00[1] = (longlong)in_RSI;
  in1_00[0] = (longlong)in_RDX;
  in1_00[2] = (longlong)in_RDI;
  in1_00[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_00,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_01[1] = (longlong)in_RSI;
  in1_01[0] = (longlong)in_RDX;
  in1_01[2] = (longlong)in_RDI;
  in1_01[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_01,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_02[1] = (longlong)in_RSI;
  in1_02[0] = (longlong)in_RDX;
  in1_02[2] = (longlong)in_RDI;
  in1_02[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_02,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_03[1] = (longlong)in_RSI;
  in1_03[0] = (longlong)in_RDX;
  in1_03[2] = (longlong)in_RDI;
  in1_03[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_03,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_04[1] = (longlong)in_RSI;
  in1_04[0] = (longlong)in_RDX;
  in1_04[2] = (longlong)in_RDI;
  in1_04[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_04,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  in1_05[1] = (longlong)in_RSI;
  in1_05[0] = (longlong)in_RDX;
  in1_05[2] = (longlong)in_RDI;
  in1_05[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_05,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  lVar1 = in_RDI[7][0];
  lVar3 = in_RDI[7][1];
  lVar5 = in_RDI[7][2];
  lVar7 = in_RDI[7][3];
  in1_06[1] = (longlong)in_RSI;
  in1_06[0] = (longlong)in_RDX;
  in1_06[2] = (longlong)in_RDI;
  in1_06[3] = (longlong)in_stack_ffffffffffffffd0;
  addsub_avx2(in_stack_ffffffffffffffd8,in1_06,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98);
  bit_00 = (int)((ulong)in_R8 >> 0x20);
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar2 = lVar1;
  lVar4 = lVar3;
  lVar6 = lVar5;
  lVar8 = lVar7;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1b][0] = lVar2;
  in_RDI[0x1b][1] = lVar4;
  in_RDI[0x1b][2] = lVar6;
  in_RDI[0x1b][3] = lVar7;
  in_RDI[0x14][0] = lVar1;
  in_RDI[0x14][1] = lVar3;
  in_RDI[0x14][2] = lVar5;
  in_RDI[0x14][3] = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar6 = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x1a][0] = lVar7;
  in_RDI[0x1a][1] = lVar2;
  in_RDI[0x1a][2] = lVar4;
  in_RDI[0x1a][3] = lVar6;
  in_RDI[0x15][0] = lVar1;
  in_RDI[0x15][1] = lVar3;
  in_RDI[0x15][2] = lVar5;
  in_RDI[0x15][3] = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar9 = lVar8;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x19][0] = lVar7;
  in_RDI[0x19][1] = lVar2;
  in_RDI[0x19][2] = lVar4;
  in_RDI[0x19][3] = lVar8;
  in_RDI[0x16][0] = lVar1;
  in_RDI[0x16][1] = lVar3;
  in_RDI[0x16][2] = lVar5;
  in_RDI[0x16][3] = lVar9;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  lVar7 = lVar1;
  lVar2 = lVar3;
  lVar4 = lVar5;
  lVar6 = lVar9;
  half_btf_avx2(in_stack_ffffffffffffffd0,in_RDI,in_RSI,in_RDX,in_RCX,bit_00);
  in_RDI[0x18][0] = lVar7;
  in_RDI[0x18][1] = lVar2;
  in_RDI[0x18][2] = lVar4;
  in_RDI[0x18][3] = lVar6;
  in_RDI[0x17][0] = lVar1;
  in_RDI[0x17][1] = lVar3;
  in_RDI[0x17][2] = lVar5;
  in_RDI[0x17][3] = lVar9;
  return;
}

Assistant:

static inline void idct32_stage8_avx2(__m256i *x, const int32_t *cospi,
                                      const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  const __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_avx2(&x[0], &x[15]);
  btf_16_adds_subs_avx2(&x[1], &x[14]);
  btf_16_adds_subs_avx2(&x[2], &x[13]);
  btf_16_adds_subs_avx2(&x[3], &x[12]);
  btf_16_adds_subs_avx2(&x[4], &x[11]);
  btf_16_adds_subs_avx2(&x[5], &x[10]);
  btf_16_adds_subs_avx2(&x[6], &x[9]);
  btf_16_adds_subs_avx2(&x[7], &x[8]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[20], &x[27], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[21], &x[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[22], &x[25], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x[23], &x[24], _r, cos_bit);
}